

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O0

string * __thiscall kratos::Param::to_string_abi_cxx11_(string *__return_storage_ptr__,Param *this)

{
  Param *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->parameter_name_);
  return __return_storage_ptr__;
}

Assistant:

std::string inline to_string() const override { return parameter_name_; }